

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

mchunkptr try_realloc_chunk(mstate m,mchunkptr p,size_t nb,int can_move)

{
  tbinptr pmVar1;
  size_t __old_len;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  malloc_tree_chunk *pmVar5;
  ulong uVar6;
  malloc_tree_chunk *pmVar7;
  malloc_tree_chunk *pmVar8;
  tbinptr pmVar9;
  tbinptr pmVar10;
  byte bVar11;
  size_t sVar12;
  char *pcVar13;
  ulong uVar14;
  mchunkptr pmVar15;
  uint uVar16;
  size_t newsize;
  size_t newsize_1;
  ulong uVar17;
  tbinptr pmVar18;
  malloc_tree_chunk *pmVar19;
  
  pmVar5 = (malloc_tree_chunk *)m->least_addr;
  if (p < pmVar5) goto LAB_001389a5;
  uVar14 = p->head;
  uVar16 = (uint)uVar14;
  if (((uVar16 & 3) == 1) || (uVar17 = uVar14 & 0xfffffffffffffff8, (long)uVar17 < 1))
  goto LAB_001389a5;
  pmVar1 = (tbinptr)((long)&p->prev_foot + uVar17);
  uVar6 = pmVar1->head;
  if ((uVar6 & 1) == 0) goto LAB_001389a5;
  if ((uVar14 & 3) == 0) {
    if (nb < 0x100) {
      return (mchunkptr)0x0;
    }
    if ((nb + 8 <= uVar17) && (uVar17 - nb <= mparams.granularity * 2)) {
      return p;
    }
    sVar12 = p->prev_foot;
    __old_len = uVar17 + 0x20 + sVar12;
    uVar14 = -mparams.page_size & nb + 0x3e + mparams.page_size;
    pcVar13 = (char *)mremap((void *)((long)p - sVar12),__old_len,uVar14,can_move);
    if (pcVar13 == (char *)0xffffffffffffffff) {
      return (mchunkptr)0x0;
    }
    pmVar15 = (mchunkptr)(pcVar13 + sVar12);
    *(ulong *)(pcVar13 + sVar12 + 8) = (uVar14 - sVar12) + -0x20;
    *(undefined8 *)((uVar14 - sVar12) + -0x18 + (long)pmVar15) = 0xb;
    pcVar2 = pcVar13 + (uVar14 - 0x10);
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    if (pcVar13 < m->least_addr) {
      m->least_addr = pcVar13;
    }
    uVar14 = (uVar14 - __old_len) + m->footprint;
    m->footprint = uVar14;
    if (m->max_footprint < uVar14) {
      m->max_footprint = uVar14;
      return pmVar15;
    }
    return pmVar15;
  }
  sVar12 = uVar17 - nb;
  if (nb <= uVar17) {
    if (sVar12 < 0x20) {
      return p;
    }
    p->head = uVar16 & 1 | nb | 2;
    *(size_t *)((long)&p->head + nb) = sVar12 | 3;
    *(byte *)&pmVar1->head = (byte)pmVar1->head | 1;
    goto LAB_001387e3;
  }
  if (pmVar1 == (tbinptr)m->top) {
    uVar17 = uVar17 + m->topsize;
    uVar14 = uVar17 - nb;
    if (uVar17 < nb || uVar14 == 0) {
      return (mchunkptr)0x0;
    }
    p->head = uVar16 & 1 | nb | 2;
    *(ulong *)((long)&p->head + nb) = uVar14 | 1;
    m->top = (mchunkptr)((long)&p->prev_foot + nb);
    m->topsize = uVar14;
    return p;
  }
  if (pmVar1 == (tbinptr)m->dv) {
    uVar17 = uVar17 + m->dvsize;
    uVar14 = uVar17 - nb;
    if (uVar17 < nb) {
      return (mchunkptr)0x0;
    }
    if (uVar14 < 0x20) {
      uVar14 = 0;
      pmVar15 = (mchunkptr)0x0;
      p->head = uVar16 & 1 | uVar17 | 2;
      pbVar3 = (byte *)((long)&p->head + uVar17);
      *pbVar3 = *pbVar3 | 1;
    }
    else {
      pmVar15 = (mchunkptr)((long)&p->prev_foot + nb);
      p->head = uVar16 & 1 | nb | 2;
      *(ulong *)((long)&p->head + nb) = uVar14 | 1;
      *(ulong *)((long)&p->prev_foot + uVar17) = uVar14;
      pbVar3 = (byte *)((long)&p->head + uVar17);
      *pbVar3 = *pbVar3 & 0xfe;
    }
    m->dvsize = uVar14;
    m->dv = pmVar15;
    return p;
  }
  if ((uVar6 & 2) != 0) {
    return (mchunkptr)0x0;
  }
  uVar17 = (uVar6 & 0xfffffffffffffff8) + uVar17;
  sVar12 = uVar17 - nb;
  if (uVar17 < nb) {
    return (mchunkptr)0x0;
  }
  if (uVar6 < 0x100) {
    pmVar7 = pmVar1->fd;
    pmVar8 = pmVar1->bk;
    if ((pmVar7 != (malloc_tree_chunk *)(m->smallbins + (uVar6 >> 3) * 2)) &&
       ((pmVar7 < pmVar5 || (pmVar7->bk != pmVar1)))) goto LAB_001389a5;
    if (pmVar8 == pmVar7) {
      bVar11 = (byte)(uVar6 >> 3) & 0x1f;
      m->smallmap = m->smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
    }
    else {
      if ((pmVar8 != (malloc_tree_chunk *)(m->smallbins + (uVar6 >> 3) * 2)) &&
         ((pmVar8 < pmVar5 || (pmVar8->fd != pmVar1)))) goto LAB_001389a5;
      pmVar7->bk = pmVar8;
      pmVar8->fd = pmVar7;
    }
  }
  else {
    pmVar18 = pmVar1->bk;
    pmVar7 = pmVar1->child[2];
    if (pmVar18 == pmVar1) {
      if (pmVar1->child[1] == (tbinptr)0x0) {
        if (pmVar1->child[0] == (tbinptr)0x0) {
          pmVar18 = (tbinptr)0x0;
          goto LAB_0013892a;
        }
        pmVar9 = pmVar1->child[0];
        pmVar8 = (malloc_tree_chunk *)pmVar1->child;
      }
      else {
        pmVar9 = pmVar1->child[1];
        pmVar8 = (malloc_tree_chunk *)(pmVar1->child + 1);
      }
      do {
        do {
          pmVar19 = pmVar8;
          pmVar18 = pmVar9;
          pmVar9 = pmVar18->child[1];
          pmVar8 = (malloc_tree_chunk *)(pmVar18->child + 1);
        } while (pmVar18->child[1] != (malloc_tree_chunk *)0x0);
        pmVar9 = pmVar18->child[0];
        pmVar8 = (malloc_tree_chunk *)pmVar18->child;
      } while (pmVar18->child[0] != (malloc_tree_chunk *)0x0);
      if (pmVar19 < pmVar5) goto LAB_001389a5;
      pmVar19->prev_foot = 0;
    }
    else {
      pmVar8 = pmVar1->fd;
      if (((pmVar8 < pmVar5) || (pmVar8->bk != pmVar1)) || (pmVar18->fd != pmVar1))
      goto LAB_001389a5;
      pmVar8->bk = pmVar18;
      pmVar18->fd = pmVar8;
    }
LAB_0013892a:
    if (pmVar7 != (malloc_tree_chunk *)0x0) {
      uVar4 = *(uint *)(pmVar1->child + 3);
      if (pmVar1 == m->treebins[uVar4]) {
        m->treebins[uVar4] = pmVar18;
        if (pmVar18 == (tbinptr)0x0) {
          bVar11 = (byte)uVar4 & 0x1f;
          m->treemap = m->treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
        }
        else {
LAB_00138969:
          pmVar9 = (tbinptr)m->least_addr;
          if (pmVar18 < pmVar9) {
LAB_001389a5:
            abort();
          }
          pmVar18->child[2] = pmVar7;
          pmVar10 = pmVar1->child[0];
          if (pmVar10 != (tbinptr)0x0) {
            if (pmVar10 < pmVar9) goto LAB_001389a5;
            pmVar18->child[0] = pmVar10;
            pmVar10->child[2] = pmVar18;
          }
          pmVar5 = pmVar1->child[1];
          if (pmVar5 != (malloc_tree_chunk *)0x0) {
            if (pmVar5 < (malloc_tree_chunk *)m->least_addr) goto LAB_001389a5;
            pmVar18->child[1] = pmVar5;
            pmVar5->parent = pmVar18;
          }
        }
      }
      else {
        if (pmVar7 < (malloc_tree_chunk *)m->least_addr) goto LAB_001389a5;
        pmVar7->child[pmVar7->child[0] != pmVar1] = pmVar18;
        if (pmVar18 != (tbinptr)0x0) goto LAB_00138969;
      }
    }
  }
  if (sVar12 < 0x20) {
    p->head = (ulong)(uVar16 & 1) + 2 + uVar17;
    pbVar3 = (byte *)((long)&p->head + uVar17);
    *pbVar3 = *pbVar3 | 1;
    return p;
  }
  p->head = uVar16 & 1 | nb | 2;
  *(size_t *)((long)&p->head + nb) = sVar12 | 3;
  pbVar3 = (byte *)((long)&p->head + uVar17);
  *pbVar3 = *pbVar3 | 1;
LAB_001387e3:
  dispose_chunk(m,(mchunkptr)((long)&p->prev_foot + nb),sVar12);
  return p;
}

Assistant:

static mchunkptr try_realloc_chunk(mstate m, mchunkptr p, size_t nb,
                                   int can_move) {
  mchunkptr newp = 0;
  size_t oldsize = chunksize(p);
  mchunkptr next = chunk_plus_offset(p, oldsize);
  if (RTCHECK(ok_address(m, p) && ok_inuse(p) &&
              ok_next(p, next) && ok_pinuse(next))) {
    if (is_mmapped(p)) {
      newp = mmap_resize(m, p, nb, can_move);
    }
    else if (oldsize >= nb) {             /* already big enough */
      size_t rsize = oldsize - nb;
      if (rsize >= MIN_CHUNK_SIZE) {      /* split off remainder */
        mchunkptr r = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        set_inuse(m, r, rsize);
        dispose_chunk(m, r, rsize);
      }
      newp = p;
    }
    else if (next == m->top) {  /* extend into top */
      if (oldsize + m->topsize > nb) {
        size_t newsize = oldsize + m->topsize;
        size_t newtopsize = newsize - nb;
        mchunkptr newtop = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        newtop->head = newtopsize |PINUSE_BIT;
        m->top = newtop;
        m->topsize = newtopsize;
        newp = p;
      }
    }
    else if (next == m->dv) { /* extend into dv */
      size_t dvs = m->dvsize;
      if (oldsize + dvs >= nb) {
        size_t dsize = oldsize + dvs - nb;
        if (dsize >= MIN_CHUNK_SIZE) {
          mchunkptr r = chunk_plus_offset(p, nb);
          mchunkptr n = chunk_plus_offset(r, dsize);
          set_inuse(m, p, nb);
          set_size_and_pinuse_of_free_chunk(r, dsize);
          clear_pinuse(n);
          m->dvsize = dsize;
          m->dv = r;
        }
        else { /* exhaust dv */
          size_t newsize = oldsize + dvs;
          set_inuse(m, p, newsize);
          m->dvsize = 0;
          m->dv = 0;
        }
        newp = p;
      }
    }
    else if (!cinuse(next)) { /* extend into next free chunk */
      size_t nextsize = chunksize(next);
      if (oldsize + nextsize >= nb) {
        size_t rsize = oldsize + nextsize - nb;
        unlink_chunk(m, next, nextsize);
        if (rsize < MIN_CHUNK_SIZE) {
          size_t newsize = oldsize + nextsize;
          set_inuse(m, p, newsize);
        }
        else {
          mchunkptr r = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, r, rsize);
          dispose_chunk(m, r, rsize);
        }
        newp = p;
      }
    }
  }
  else {
    USAGE_ERROR_ACTION(m, chunk2mem(p));
  }
  return newp;
}